

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::MatchLiteralInst::Exec
          (MatchLiteralInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  Char CVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  Program *pPVar5;
  undefined4 *puVar6;
  char16_t **ppcVar7;
  char16_t *pcVar8;
  Char *pCVar9;
  Char *literalEnd;
  Char *inputCurr;
  Char *literalCurr;
  Char *literalBuffer;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  MatchLiteralInst *this_local;
  
  uVar2 = (this->super_LiteralMixin).length;
  pPVar5 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&matcher->program);
  if ((pPVar5->rep).insts.litbufLen - (this->super_LiteralMixin).offset < uVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x64c,"(length <= matcher.program->rep.insts.litbufLen - offset)",
                       "length <= matcher.program->rep.insts.litbufLen - offset");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (inputLength - *inputOffset < (this->super_LiteralMixin).length) {
    this_local._7_1_ =
         Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  else {
    pPVar5 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&matcher->program);
    ppcVar7 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                        ((WriteBarrierPtr *)&(pPVar5->rep).insts.litbuf);
    inputCurr = *ppcVar7 + (this->super_LiteralMixin).offset;
    uVar2 = *inputOffset;
    Matcher::CompStats(matcher);
    if (*inputCurr == input[uVar2]) {
      pcVar8 = inputCurr + (this->super_LiteralMixin).length;
      literalEnd = input + uVar2 + 1;
      do {
        inputCurr = inputCurr + 1;
        if (pcVar8 <= inputCurr) {
          *inputOffset = (CharCount)((long)literalEnd - (long)input >> 1);
          *instPointer = *instPointer + 9;
          return false;
        }
        Matcher::CompStats(matcher);
        pCVar9 = literalEnd + 1;
        CVar1 = *literalEnd;
        literalEnd = pCVar9;
      } while (*inputCurr == CVar1);
      *inputOffset = (CharCount)((long)pCVar9 - (long)input >> 1);
      this_local._7_1_ =
           Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
    }
    else {
      *inputOffset = *inputOffset + 1;
      this_local._7_1_ =
           Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool MatchLiteralInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        Assert(length <= matcher.program->rep.insts.litbufLen - offset);

        if (length > inputLength - inputOffset)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        const Char *const literalBuffer = matcher.program->rep.insts.litbuf;
        const Char * literalCurr = literalBuffer + offset;
        const Char * inputCurr = input + inputOffset;

#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (*literalCurr != *inputCurr)
        {
            inputOffset++;
            return matcher.Fail(FAIL_PARAMETERS);
        }

        const Char *const literalEnd = literalCurr + length;
        literalCurr++;
        inputCurr++;

        while (literalCurr < literalEnd)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            if (*literalCurr != *inputCurr++)
            {
                inputOffset = (CharCount)(inputCurr - input);
                return matcher.Fail(FAIL_PARAMETERS);
            }
            literalCurr++;
        }

        inputOffset = (CharCount)(inputCurr - input);
        instPointer += sizeof(*this);
        return false;
    }